

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v5::internal::
          parse_format_specs<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                    *handler)

{
  wchar_t *pwVar1;
  int iVar2;
  uint precision;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
  *in_RDX;
  wchar_t *in_RSI;
  wchar_t *in_RDI;
  int c;
  char *in_stack_ffffffffffffffa8;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
  *in_stack_ffffffffffffffb0;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
  *psVar3;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
  *in_stack_ffffffffffffffb8;
  wchar_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  wchar_t wVar4;
  undefined4 in_stack_ffffffffffffffcc;
  precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>_&,_wchar_t>
  in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  wchar_t *local_10;
  wchar_t *local_8;
  
  local_8 = in_RDI;
  if (((in_RDI != in_RSI) && (*in_RDI != L'}')) &&
     (local_10 = parse_align<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&>
                           ((wchar_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                            ,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8),
     local_8 = local_10, local_10 != in_RSI)) {
    iVar2 = (int)(char)*local_10;
    if (iVar2 == 0x20) {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
      ::on_space(in_stack_ffffffffffffffb0);
      local_10 = local_10 + 1;
    }
    else if (iVar2 == 0x2b) {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
      ::on_plus(in_stack_ffffffffffffffb0);
      local_10 = local_10 + 1;
    }
    else if (iVar2 == 0x2d) {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
      ::on_minus(in_stack_ffffffffffffffb0);
      local_10 = local_10 + 1;
    }
    if (local_10 == in_RSI) {
      local_8 = local_10;
    }
    else {
      if (*local_10 == L'#') {
        specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
        ::on_hash(in_stack_ffffffffffffffb0);
        local_10 = local_10 + 1;
        if (local_10 == in_RSI) {
          return local_10;
        }
      }
      if (*local_10 == L'0') {
        specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
        ::on_zero(in_stack_ffffffffffffffb0);
        if (local_10 + 1 == in_RSI) {
          return local_10 + 1;
        }
      }
      local_10 = parse_width<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&>
                           ((wchar_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                            ,(wchar_t *)in_stack_ffffffffffffffd0.handler,
                            (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                             *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
      local_8 = local_10;
      if (local_10 != in_RSI) {
        if (*local_10 == L'.') {
          pwVar1 = local_10 + 1;
          if (pwVar1 == in_RSI) {
            wVar4 = L'\0';
          }
          else {
            wVar4 = *pwVar1;
          }
          if ((wVar4 < L'0') || (L'9' < wVar4)) {
            if (wVar4 != L'{') {
              specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
              ::on_error(&in_stack_ffffffffffffffb0->
                          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                         ,in_stack_ffffffffffffffa8);
              return pwVar1;
            }
            psVar3 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                      *)(local_10 + 2);
            local_10 = (wchar_t *)psVar3;
            if (psVar3 != (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                           *)in_RSI) {
              precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>_&,_wchar_t>
              ::precision_adapter((precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>_&,_wchar_t>
                                   *)&stack0xffffffffffffffd0,in_RDX);
              local_10 = parse_arg_id<wchar_t,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&,wchar_t>>
                                   (in_RSI,(wchar_t *)in_RDX,
                                    (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>_&,_wchar_t>
                                     *)CONCAT44(wVar4,in_stack_ffffffffffffffd8));
              in_stack_ffffffffffffffb0 = psVar3;
            }
            if ((local_10 == in_RSI) ||
               (pwVar1 = local_10 + 1, wVar4 = *local_10, local_10 = pwVar1, wVar4 != L'}')) {
              specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
              ::on_error(&in_stack_ffffffffffffffb0->
                          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                         ,in_stack_ffffffffffffffa8);
              return local_10;
            }
          }
          else {
            psVar3 = in_RDX;
            precision = parse_nonnegative_int<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&>
                                  ((wchar_t **)CONCAT44(iVar2,wVar4),(wchar_t *)in_RDX,
                                   in_stack_ffffffffffffffb8);
            specs_setter<wchar_t>::on_precision((specs_setter<wchar_t> *)in_RDX,precision);
            in_RDX = psVar3;
            local_10 = pwVar1;
          }
          specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
          ::end_precision(in_stack_ffffffffffffffb0);
        }
        if ((local_10 != in_RSI) && (*local_10 != L'}')) {
          specs_setter<wchar_t>::on_type((specs_setter<wchar_t> *)in_RDX,*local_10);
          local_10 = local_10 + 1;
        }
        local_8 = local_10;
      }
    }
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR const Char *parse_format_specs(
    const Char *begin, const Char *end, SpecHandler &&handler) {
  if (begin == end || *begin == '}')
    return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    ++begin;
    auto c = begin != end ? *begin : 0;
    if ('0' <= c && c <= '9') {
      handler.on_precision(parse_nonnegative_int(begin, end, handler));
    } else if (c == '{') {
      ++begin;
      if (begin != end) {
        begin = parse_arg_id(
              begin, end, precision_adapter<SpecHandler, Char>(handler));
      }
      if (begin == end || *begin++ != '}')
        return handler.on_error("invalid format string"), begin;
    } else {
      return handler.on_error("missing precision specifier"), begin;
    }
    handler.end_precision();
  }

  // Parse type.
  if (begin != end && *begin != '}')
    handler.on_type(*begin++);
  return begin;
}